

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::HandleJoystickHatMotionEvent(CInput *this,SDL_Event *Event)

{
  SDL_JoystickID SVar1;
  int Key_00;
  int Flags;
  CJoystick *this_00;
  CInput *in_RSI;
  long *in_RDI;
  int Key;
  int CurrentKey;
  CJoystick *pJoystick;
  
  this_00 = (CJoystick *)(**(code **)(*in_RDI + 0x38))();
  if (((this_00 != (CJoystick *)0x0) &&
      (SVar1 = CJoystick::GetInstanceID(this_00),
      SVar1 == *(int *)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface.m_pKernel)) &&
     (*(byte *)((long)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface.m_pKernel + 4) < 2
     )) {
    Key_00 = CJoystick::GetJoystickHatKey
                       ((uint)*(byte *)((long)&(in_RSI->super_IEngineInput).super_IInput.
                                               super_IInterface.m_pKernel + 4),
                        (uint)*(byte *)((long)&(in_RSI->super_IEngineInput).super_IInput.
                                               super_IInterface.m_pKernel + 5));
    for (Flags = (uint)*(byte *)((long)&(in_RSI->super_IEngineInput).super_IInput.super_IInterface.
                                        m_pKernel + 4) * 8 + 0x1b2;
        Flags <= (int)((uint)*(byte *)((long)&(in_RSI->super_IEngineInput).super_IInput.
                                              super_IInterface.m_pKernel + 4) * 8 + 0x1b9);
        Flags = Flags + 1) {
      if ((Flags != Key_00) && ((*(byte *)((long)in_RDI + (long)Flags + 0x1aa0) & 1) != 0)) {
        *(undefined1 *)((long)in_RDI + (long)Flags + 0x1aa0) = 0;
        AddEvent(in_RSI,(char *)this_00,Key_00,Flags);
      }
    }
    if (-1 < Key_00) {
      *(undefined1 *)((long)in_RDI + (long)Key_00 + 0x1aa0) = 1;
      *(short *)((long)in_RDI + (long)Key_00 * 2 + 0x16a0) = (short)(int)in_RDI[0x394];
      AddEvent(in_RSI,(char *)this_00,Key_00,Flags);
    }
  }
  return;
}

Assistant:

void CInput::HandleJoystickHatMotionEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jhat.which)
		return;
	if(Event.jhat.hat >= NUM_JOYSTICK_HATS)
		return;

	const int CurrentKey = CJoystick::GetJoystickHatKey(Event.jhat.hat, Event.jhat.value);

	for(int Key = KEY_JOY_HAT0_LEFTUP + Event.jhat.hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key <= KEY_JOY_HAT0_RIGHTDOWN + Event.jhat.hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key++)
	{
		if(Key != CurrentKey && m_aInputState[Key])
		{
			m_aInputState[Key] = false;
			AddEvent(0, Key, IInput::FLAG_RELEASE);
		}
	}

	if(CurrentKey >= 0)
	{
		m_aInputState[CurrentKey] = true;
		m_aInputCount[CurrentKey] = m_InputCounter;
		AddEvent(0, CurrentKey, IInput::FLAG_PRESS);
	}
}